

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

void __thiscall
asmjit::_abi_1_10::CallConv::setPassedOrder
          (CallConv *this,RegGroup group,uint32_t a0,uint32_t a1,uint32_t a2,uint32_t a3,uint32_t a4
          ,uint32_t a5,uint32_t a6,uint32_t a7)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  uint32_t in_ECX;
  uint32_t in_EDX;
  RegGroup in_SIL;
  uint32_t in_R8D;
  uint32_t in_R9D;
  uint32_t in_stack_00000008;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  uint32_t in_stack_00000020;
  char *in_stack_00000380;
  int in_stack_0000038c;
  char *in_stack_00000390;
  RegGroup *in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff9c;
  uint32_t in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  uint32_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  RegGroup group_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_44;
  undefined4 local_3c;
  undefined4 local_34;
  
  group_00 = (RegGroup)((uint)in_stack_ffffffffffffffac >> 0x18);
  bVar1 = operator<=(in_SIL,kExtraVirt3);
  if (!bVar1) {
    DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
  }
  Support::bytepack32_4x8(in_EDX,in_ECX,in_R8D,in_R9D);
  Support::bytepack32_4x8(in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  _setPassedPacked((CallConv *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   group_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                   in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  if (in_EDX == 0xff) {
    local_34 = 0;
  }
  else {
    local_34 = 1 << ((byte)in_EDX & 0x1f);
  }
  if (in_ECX == 0xff) {
    local_3c = 0;
  }
  else {
    local_3c = 1 << ((byte)in_ECX & 0x1f);
  }
  if (in_R8D == 0xff) {
    local_44 = 0;
  }
  else {
    local_44 = 1 << ((byte)in_R8D & 0x1f);
  }
  if (in_R9D == 0xff) {
    uVar2 = 0;
  }
  else {
    uVar2 = 1 << ((byte)in_R9D & 0x1f);
  }
  if (in_stack_00000008 == 0xff) {
    uVar3 = 0;
  }
  else {
    uVar3 = 1 << ((byte)in_stack_00000008 & 0x1f);
  }
  if (in_stack_00000010 == 0xff) {
    uVar4 = 0;
  }
  else {
    uVar4 = 1 << ((byte)in_stack_00000010 & 0x1f);
  }
  if (in_stack_00000018 == 0xff) {
    uVar5 = 0;
  }
  else {
    uVar5 = 1 << ((byte)in_stack_00000018 & 0x1f);
  }
  if (in_stack_00000020 == 0xff) {
    uVar6 = 0;
  }
  else {
    uVar6 = 1 << ((byte)in_stack_00000020 & 0x1f);
  }
  uVar2 = local_34 | local_3c | local_44 | uVar2 | uVar3 | uVar4 | uVar5 | uVar6;
  puVar7 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::_abi_1_10::RegGroup>
                     ((Array<unsigned_int,_4UL> *)CONCAT44(uVar6,uVar2),in_stack_ffffffffffffff88);
  *puVar7 = uVar2;
  return;
}

Assistant:

inline void setPassedOrder(RegGroup group, uint32_t a0, uint32_t a1 = 0xFF, uint32_t a2 = 0xFF, uint32_t a3 = 0xFF, uint32_t a4 = 0xFF, uint32_t a5 = 0xFF, uint32_t a6 = 0xFF, uint32_t a7 = 0xFF) noexcept {
    ASMJIT_ASSERT(group <= RegGroup::kMaxVirt);

    // NOTE: This should always be called with all arguments known at compile time, so even if it looks scary it
    // should be translated into few instructions.
    _setPassedPacked(group, Support::bytepack32_4x8(a0, a1, a2, a3),
                            Support::bytepack32_4x8(a4, a5, a6, a7),
                            0xFFFFFFFFu,
                            0xFFFFFFFFu);

    _passedRegs[group] = (a0 != 0xFF ? 1u << a0 : 0u) |
                         (a1 != 0xFF ? 1u << a1 : 0u) |
                         (a2 != 0xFF ? 1u << a2 : 0u) |
                         (a3 != 0xFF ? 1u << a3 : 0u) |
                         (a4 != 0xFF ? 1u << a4 : 0u) |
                         (a5 != 0xFF ? 1u << a5 : 0u) |
                         (a6 != 0xFF ? 1u << a6 : 0u) |
                         (a7 != 0xFF ? 1u << a7 : 0u) ;
  }